

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t psa_hmac_finish_internal(psa_hmac_internal_data *hmac,uint8_t *mac,size_t mac_size)

{
  psa_algorithm_t alg;
  psa_status_t pVar1;
  size_t input_length;
  size_t hash_size;
  uint8_t tmp [64];
  
  alg = (hmac->hash_ctx).alg;
  hash_size = 0;
  input_length = psa_get_hash_block_size(alg);
  pVar1 = psa_hash_finish(&hmac->hash_ctx,tmp,0x40,&hash_size);
  if (pVar1 == 0) {
    pVar1 = psa_hash_setup(&hmac->hash_ctx,alg);
    if ((((pVar1 == 0) &&
         (pVar1 = psa_hash_update(&hmac->hash_ctx,hmac->opad,input_length), pVar1 == 0)) &&
        (pVar1 = psa_hash_update(&hmac->hash_ctx,tmp,hash_size), pVar1 == 0)) &&
       (pVar1 = psa_hash_finish(&hmac->hash_ctx,tmp,0x40,&hash_size), pVar1 == 0)) {
      memcpy(mac,tmp,mac_size);
      pVar1 = 0;
    }
    mbedtls_platform_zeroize(tmp,hash_size);
  }
  return pVar1;
}

Assistant:

static psa_status_t psa_hmac_finish_internal( psa_hmac_internal_data *hmac,
                                              uint8_t *mac,
                                              size_t mac_size )
{
    uint8_t tmp[MBEDTLS_MD_MAX_SIZE];
    psa_algorithm_t hash_alg = hmac->hash_ctx.alg;
    size_t hash_size = 0;
    size_t block_size = psa_get_hash_block_size( hash_alg );
    psa_status_t status;

    status = psa_hash_finish( &hmac->hash_ctx, tmp, sizeof( tmp ), &hash_size );
    if( status != PSA_SUCCESS )
        return( status );
    /* From here on, tmp needs to be wiped. */

    status = psa_hash_setup( &hmac->hash_ctx, hash_alg );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_hash_update( &hmac->hash_ctx, hmac->opad, block_size );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_hash_update( &hmac->hash_ctx, tmp, hash_size );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_hash_finish( &hmac->hash_ctx, tmp, sizeof( tmp ), &hash_size );
    if( status != PSA_SUCCESS )
        goto exit;

    memcpy( mac, tmp, mac_size );

exit:
    mbedtls_platform_zeroize( tmp, hash_size );
    return( status );
}